

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

FlagMap * absl::internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_(void)

{
  int iVar1;
  _Rb_tree_header *p_Var2;
  
  if (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_);
    if (iVar1 != 0) {
      GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_ = (FlagMap *)operator_new(0x30);
      p_Var2 = &(GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
      (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var2->_M_header;
      (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var2->_M_header;
      (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      __cxa_guard_release(&GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_);
    }
  }
  return GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_;
}

Assistant:

FlagMap *GetFlagMap() {
  static auto *flag_map = new FlagMap;
  return flag_map;
}